

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

Excluded s2pred::TriageVoronoiSiteExclusion<double>
                   (Vector3<double> *a,Vector3<double> *b,Vector3<double> *x0,Vector3<double> *x1,
                   double r2)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Excluded EVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  S2LogMessage local_40;
  
  dVar8 = x0->c_[0] - x1->c_[0];
  dVar12 = x0->c_[1] - x1->c_[1];
  dVar15 = x0->c_[2] - x1->c_[2];
  dVar27 = x0->c_[0] + x1->c_[0];
  dVar26 = x0->c_[1] + x1->c_[1];
  dVar16 = x0->c_[2] + x1->c_[2];
  dVar13 = dVar12 * dVar16 - dVar26 * dVar15;
  dVar16 = dVar15 * dVar27 - dVar16 * dVar8;
  dVar27 = dVar26 * dVar8 - dVar27 * dVar12;
  dVar8 = dVar27 * dVar27 + dVar16 * dVar16 + dVar13 * dVar13;
  if (dVar8 < 0.0) {
    dVar12 = sqrt(dVar8);
  }
  else {
    dVar12 = SQRT(dVar8);
  }
  dVar15 = x0->c_[0];
  dVar26 = x0->c_[1];
  dVar17 = x0->c_[2];
  dVar9 = a->c_[0];
  dVar11 = a->c_[1];
  dVar28 = a->c_[2];
  dVar2 = (dVar17 - dVar28) * (dVar17 - dVar28) +
          (dVar26 - dVar11) * (dVar26 - dVar11) + (dVar15 - dVar9) * (dVar15 - dVar9);
  dVar19 = x1->c_[0] - dVar9;
  dVar22 = x1->c_[1] - dVar11;
  dVar20 = x1->c_[2] - dVar28;
  dVar19 = dVar20 * dVar20 + dVar22 * dVar22 + dVar19 * dVar19;
  if (dVar19 <= dVar2) {
    if ((dVar2 == dVar19) && (!NAN(dVar2) && !NAN(dVar19))) {
      lVar6 = 0;
      do {
        dVar20 = *(double *)((long)x0->c_ + lVar6);
        dVar22 = *(double *)((long)x1->c_ + lVar6);
        if (dVar20 != dVar22) {
          if (dVar20 < dVar22) goto LAB_0021d8e5;
          break;
        }
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x18);
    }
    dVar15 = x1->c_[0];
    dVar26 = x1->c_[1];
    dVar17 = x1->c_[2];
    dVar2 = dVar19;
  }
LAB_0021d8e5:
  dVar19 = (dVar12 * 6.964101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16;
  dVar20 = (r2 * -0.25 + 1.0) * r2 * dVar8;
  dVar15 = (dVar28 - dVar17) * dVar27 + (dVar11 - dVar26) * dVar16 + (dVar9 - dVar15) * dVar13 + 0.0
  ;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = dVar2 * dVar19;
  dVar26 = dVar20 - dVar15 * dVar15;
  dVar9 = ABS(dVar15);
  dVar11 = (dVar9 + dVar9 + dVar2) * dVar2 + dVar15 * dVar15 * 1.3322676295501878e-15 +
           dVar20 * 6.661338147750939e-16;
  dVar17 = dVar26 - dVar11;
  if (0.0 <= dVar17) {
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar28 = x0->c_[0];
    dVar22 = x0->c_[1];
    dVar10 = x0->c_[2];
    dVar14 = b->c_[0];
    dVar25 = b->c_[1];
    dVar1 = b->c_[2];
    dVar18 = (dVar10 - dVar1) * (dVar10 - dVar1) +
             (dVar22 - dVar25) * (dVar22 - dVar25) + (dVar28 - dVar14) * (dVar28 - dVar14);
    dVar23 = x1->c_[0] - dVar14;
    dVar24 = x1->c_[1] - dVar25;
    dVar21 = x1->c_[2] - dVar1;
    dVar21 = dVar21 * dVar21 + dVar24 * dVar24 + dVar23 * dVar23;
    if (dVar21 <= dVar18) {
      if ((dVar18 == dVar21) && (!NAN(dVar18) && !NAN(dVar21))) {
        lVar6 = 0;
        do {
          dVar23 = *(double *)((long)x0->c_ + lVar6);
          dVar24 = *(double *)((long)x1->c_ + lVar6);
          if (dVar23 != dVar24) {
            if (dVar23 < dVar24) goto LAB_0021db3c;
            break;
          }
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x18);
      }
      dVar28 = x1->c_[0];
      dVar22 = x1->c_[1];
      dVar10 = x1->c_[2];
      dVar18 = dVar21;
    }
LAB_0021db3c:
    dVar28 = (dVar1 - dVar10) * dVar27 +
             (dVar25 - dVar22) * dVar16 + (dVar14 - dVar28) * dVar13 + 0.0;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar19 = dVar19 * dVar18;
    dVar22 = dVar20 - dVar28 * dVar28;
    dVar14 = ABS(dVar28);
    dVar10 = dVar20 * 6.661338147750939e-16 +
             (dVar14 + dVar14 + dVar19) * dVar19 + dVar28 * dVar28 * 1.3322676295501878e-15;
    dVar20 = dVar22 - dVar10;
    if (0.0 <= dVar20) {
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      dVar25 = r2 * -0.5 + 1.0;
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      dVar1 = (dVar22 - dVar26) * dVar25;
      dVar18 = ABS(dVar1);
      dVar22 = dVar18 * 3.3306690738754696e-16 +
               (dVar26 * 1.6653345369377348e-16 + (dVar11 * 0.5) / dVar17 +
               dVar22 * 1.6653345369377348e-16 + (dVar10 * 0.5) / dVar20) * dVar25;
      dVar11 = a->c_[0] - b->c_[0];
      dVar20 = a->c_[1] - b->c_[1];
      dVar25 = a->c_[2] - b->c_[2];
      dVar26 = a->c_[0] + b->c_[0];
      dVar10 = a->c_[1] + b->c_[1];
      dVar17 = a->c_[2] + b->c_[2];
      dVar21 = dVar20 * dVar17 - dVar10 * dVar25;
      dVar25 = dVar25 * dVar26 - dVar17 * dVar11;
      dVar17 = dVar10 * dVar11 - dVar26 * dVar20;
      dVar26 = dVar17 * dVar17 + dVar25 * dVar25 + dVar21 * dVar21;
      if (dVar26 < 0.0) {
        dVar26 = sqrt(dVar26);
      }
      else {
        dVar26 = SQRT(dVar26);
      }
      dVar27 = (dVar27 * dVar17 + dVar16 * dVar25 + dVar13 * dVar21 + 0.0) * 0.5;
      dVar16 = (dVar12 + dVar26) * 3.4158679198689225e-31 + dVar26 * 1.1062375032830644e-15 * dVar12
      ;
      if (dVar18 - dVar27 < -(dVar22 + dVar16)) {
        return NEITHER;
      }
      dVar12 = (a->c_[2] * b->c_[2] + a->c_[1] * b->c_[1] + a->c_[0] * b->c_[0] + 0.0) * dVar8 -
               dVar15 * dVar28;
      dVar8 = dVar8 * 1.7763568394002505e-15 +
              (dVar2 + dVar9) * dVar19 + (dVar9 * 1.4432899320127035e-15 + dVar2) * dVar14;
      if (dVar12 <= -dVar8) {
        return NEITHER;
      }
      if (dVar8 <= dVar12) {
        if (-dVar16 <= dVar27) {
          if (dVar27 <= dVar16) {
            return UNCERTAIN;
          }
        }
        else {
          S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_40,2.0);
          uVar4 = 0xffffffff;
          uVar3 = 0xffffffff;
          if (-dVar22 <= dVar1) {
            uVar3 = TriageCompareCosDistance<double>(a,x0,(double)local_40._0_8_);
          }
          if (dVar1 <= dVar22) {
            uVar4 = TriageCompareCosDistance<double>(b,x1,(double)local_40._0_8_);
          }
          if ((int)(uVar4 & uVar3) < 0) {
            EVar5 = NEITHER;
            bVar7 = false;
          }
          else {
            bVar7 = dVar22 < dVar18 && (0 < (int)uVar4 || 0 < (int)uVar3);
            EVar5 = UNCERTAIN;
          }
          if (!bVar7) {
            return EVar5;
          }
        }
        if (dVar18 - dVar27 <= dVar22 + dVar16) {
          return UNCERTAIN;
        }
        if (dVar18 <= dVar22) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x4f4,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: (abs_lhs3) > (lhs3_error) ",0x28);
          abort();
        }
        return (uint)(dVar1 <= 0.0);
      }
    }
  }
  return UNCERTAIN;
}

Assistant:

Excluded TriageVoronoiSiteExclusion(const Vector3<T>& a, const Vector3<T>& b,
                                    const Vector3<T>& x0, const Vector3<T>& x1,
                                    T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius r (i.e., squared chord angle length r2).  Similarly, define the
  // "coverage interval" of S along an edge X to be the intersection of X with
  // the coverage disc of S.  The coverage interval can be represented as the
  // point at the center of the interval and an angle that measures the
  // semi-width or "radius" of the interval.
  //
  // To test whether site A excludes site B along the input edge X, we test
  // whether the coverage interval of A contains the coverage interval of B.
  // Let "ra" and "rb" be the radii (semi-widths) of the two intervals, and
  // let "d" be the angle between their center points.  Then "a" properly
  // contains "b" if (ra - rb > d), and "b" contains "a" if (rb - ra > d).
  // Note that only one of these conditions can be true.  Therefore we can
  // determine whether one site excludes the other by checking whether
  //
  // (1)   |rb - ra| > d
  //
  // and use the sign of (rb - ra) to determine which site is excluded.
  //
  // The actual code is based on the following.  Let A1 and B1 be the unit
  // vectors A and B scaled by cos(r) (these points are inside the sphere).
  // The planes perpendicular to OA1 and OA2 cut off two discs of radius r
  // around A and B.  Now consider the two lines (inside the sphere) where
  // these planes intersect the plane containing the input edge X, and let A2
  // and B2 be the points on these lines that are closest to A and B.  The
  // coverage intervals of A and B can be represented as an interval along
  // each of these lines, centered at A2 and B2.  Let P1 and P2 be the
  // endpoints of the coverage interval for A, and let Q1 and Q2 be the
  // endpoints of the coverage interval for B.  We can view each coverage
  // interval as either a chord through the sphere's interior, or as a segment
  // of the original edge X (by projecting the chord onto the sphere's
  // surface).
  //
  // To check whether B's interval is contained by A's interval, we test
  // whether both endpoints of B's interval (Q1 and Q2) are contained by A's
  // interval.  E.g., we could test whether Qi.DotProd(A2) > A2.Norm2().
  //
  // However rather than constructing the actual points A1, A2, and so on, it
  // turns out to be more efficient to compute the sines and cosines
  // ("components") of the various angles and then use trigonometric
  // identities.  Predicate (1) can be expressed as
  //
  //      |sin(rb - ra)| > sin(d)
  //
  // provided that |d| <= Pi/2 (which must be checked), and then expanded to
  //
  // (2)  |sin(rb) cos(ra) - sin(ra) cos(rb)| > sin(d) .
  //
  // The components of the various angles can be expressed using dot and cross
  // products based on the construction above:
  //
  //   sin(ra) = sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2) / |aXn|
  //   cos(ra) = cos(r) |a| |n| / |aXn|
  //   sin(rb) = sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) / |bXn|
  //   cos(rb) = cos(r) |b| |n| / |bXn|
  //   sin(d)  = (aXb).n |n| / (|aXn| |bXn|)
  //   cos(d)  = (aXn).(bXn) / (|aXn| |bXn|)
  //
  // Also, the squared chord length r2 is equal to 4 * sin^2(r / 2), which
  // yields the following relationships:
  //
  //   sin(r)  = sqrt(r2 (1 - r2 / 4))
  //   cos(r)  = 1 - r2 / 2
  //
  // We then scale both sides of (2) by |aXn| |bXn| / |n| (in order to
  // minimize the number of calculations and to avoid divisions), which gives:
  //
  //    cos(r) ||a| sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) -
  //            |b| sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2)| > (aXb).n
  //
  // Furthermore we can substitute |a| = |b| = 1 (as long as this is taken
  // into account in the error bounds), yielding
  //
  // (3)   cos(r) |sqrt(sin^2(r) |n|^2 - |b.n|^2) -
  //               sqrt(sin^2(r) |n|^2 - |a.n|^2)| > (aXb).n
  //
  // The code below is more complicated than this because many expressions
  // have been modified for better numerical stability.  For example, dot
  // products between unit vectors are computed using (x - y).DotProd(x + y),
  // and the dot product between a point P and the normal N of an edge X is
  // measured using (P - Xi).DotProd(N) where Xi is the endpoint of X that is
  // closer to P.

  Vector3<T> n = (x0 - x1).CrossProd(x0 + x1);  // 2 * x0.CrossProd(x1)
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  // This factor is used in the error terms of dot products with "n" below.
  T Dn_error = ((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;

  T cos_r = 1 - 0.5 * r2;
  T sin2_r = r2 * (1 - 0.25 * r2);
  T n2sin2_r = n2 * sin2_r;

  // "ra" and "rb" denote sin(ra) and sin(rb) after the scaling above.
  T ax2, aDn = (a - GetClosestVertex(a, x0, x1, &ax2)).DotProd(n);
  T aDn2 = aDn * aDn;
  T aDn_error = Dn_error * sqrt(ax2);
  T ra2 = n2sin2_r - aDn2;
  T ra2_error = (8 * DBL_ERR + 4 * T_ERR) * aDn2 +
      (2 * fabs(aDn) + aDn_error) * aDn_error + 6 * T_ERR * n2sin2_r;
  // This is the minimum possible value of ra2, which is used to bound the
  // derivative of sqrt(ra2) in computing ra_error below.
  T min_ra2 = ra2 - ra2_error;
  if (min_ra2 < 0) return Excluded::UNCERTAIN;
  T ra = sqrt(ra2);
  // Includes the ra2 subtraction error above.
  T ra_error = 1.5 * T_ERR * ra + 0.5 * ra2_error / sqrt(min_ra2);

  T bx2, bDn = (b - GetClosestVertex(b, x0, x1, &bx2)).DotProd(n);
  T bDn2 = bDn * bDn;
  T bDn_error = Dn_error * sqrt(bx2);
  T rb2 = n2sin2_r - bDn2;
  T rb2_error = (8 * DBL_ERR + 4 * T_ERR) * bDn2 +
      (2 * fabs(bDn) + bDn_error) * bDn_error + 6 * T_ERR * n2sin2_r;
  T min_rb2 = rb2 - rb2_error;
  if (min_rb2 < 0) return Excluded::UNCERTAIN;
  T rb = sqrt(rb2);
  // Includes the rb2 subtraction error above.
  T rb_error = 1.5 * T_ERR * rb + 0.5 * rb2_error / sqrt(min_rb2);

  // The sign of LHS(3) determines which site may be excluded by the other.
  T lhs3 = cos_r * (rb - ra);
  T abs_lhs3 = fabs(lhs3);
  T lhs3_error = cos_r * (ra_error + rb_error) + 3 * T_ERR * abs_lhs3;

  // Now we evaluate the RHS of (3), which is proportional to sin(d).
  Vector3<T> aXb = (a - b).CrossProd(a + b);  // 2 * a.CrossProd(b)
  T aXb1 = aXb.Norm();
  T sin_d = 0.5 * aXb.DotProd(n);
  T sin_d_error = (4 * DBL_ERR + (2.5 + 2 * sqrt(3)) * T_ERR) * aXb1 * n1 +
      16 * sqrt(3) * DBL_ERR * T_ERR * (aXb1 + n1);

  // If LHS(3) is definitely less than RHS(3), neither site excludes the other.
  T result = abs_lhs3 - sin_d;
  T result_error = lhs3_error + sin_d_error;
  if (result < -result_error) return Excluded::NEITHER;

  // Otherwise, before proceeding further we need to check that |d| <= Pi/2.
  // In fact, |d| < Pi/2 is enough because of the requirement that r < Pi/2.
  // The following expression represents cos(d) after scaling; it is
  // equivalent to (aXn).(bXn) but has about 30% less error.
  T cos_d = a.DotProd(b) * n2 - aDn * bDn;
  T cos_d_error =
      ((8 * DBL_ERR + 5 * T_ERR) * fabs(aDn) + aDn_error) * fabs(bDn) +
      (fabs(aDn) + aDn_error) * bDn_error + (8 * DBL_ERR + 8 * T_ERR) * n2;
  if (cos_d <= -cos_d_error) return Excluded::NEITHER;

  // Potential optimization: if the sign of cos(d) is uncertain, then instead
  // we could check whether cos(d) >= cos(r).  Unfortunately this is fairly
  // expensive since it requires computing denominator |aXn||bXn| of cos(d)
  // and the associated error bounds.  In any case this case is relatively
  // rare so it seems better to punt.
  if (cos_d < cos_d_error) return Excluded::UNCERTAIN;

  // Normally we have d > 0 because the sites are sorted so that A is closer
  // to X0 and B is closer to X1.  However if the edge X is longer than Pi/2,
  // and the sites A and B are beyond its endpoints, then AB can wrap around
  // the sphere in the opposite direction from X.  In this situation d < 0 but
  // each site is closest to one endpoint of X, so neither excludes the other.
  //
  // It turns out that this can happen only when the site that is further away
  // from edge X is less than 90 degrees away from whichever endpoint of X it
  // is closer to.  It is provable that if this distance is less than 90
  // degrees, then it is also less than r2, and therefore the Voronoi regions
  // of both sites intersect the edge.
  if (sin_d < -sin_d_error) {
    T r90 = S1ChordAngle::Right().length2();
    // "ca" is negative if Voronoi region A definitely intersects edge X.
    int ca = (lhs3 < -lhs3_error) ? -1 : TriageCompareCosDistance(a, x0, r90);
    int cb = (lhs3 > lhs3_error) ? -1 : TriageCompareCosDistance(b, x1, r90);
    if (ca < 0 && cb < 0) return Excluded::NEITHER;
    if (ca <= 0 && cb <= 0) return Excluded::UNCERTAIN;
    if (abs_lhs3 <= lhs3_error) return Excluded::UNCERTAIN;
  } else if (sin_d <= sin_d_error) {
    return Excluded::UNCERTAIN;
  }
  // Now we can finish checking the results of predicate (3).
  if (result <= result_error) return Excluded::UNCERTAIN;
  S2_DCHECK_GT(abs_lhs3, lhs3_error);
  return (lhs3 > 0) ? Excluded::FIRST : Excluded::SECOND;
}